

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int DisconnectHokuyo(HOKUYO *pHokuyo)

{
  int iVar1;
  size_t sVar2;
  uint8 local_1c [4];
  int sendbuflen;
  char sendbuf [4];
  HOKUYO *pHokuyo_local;
  
  _sendbuflen = pHokuyo;
  memset(local_1c,0,4);
  strcpy((char *)local_1c,"QT\n");
  sVar2 = strlen((char *)local_1c);
  iVar1 = WriteAllRS232Port(&_sendbuflen->RS232Port,local_1c,(int)sVar2);
  if (iVar1 == 0) {
    iVar1 = CloseRS232Port(&_sendbuflen->RS232Port);
    if (iVar1 == 0) {
      printf("Hokuyo disconnected.\n");
      pHokuyo_local._4_4_ = 0;
    }
    else {
      printf("Hokuyo disconnection failed.\n");
      pHokuyo_local._4_4_ = 1;
    }
  }
  else {
    printf("Error while disconnecting a Hokuyo.\n");
    CloseRS232Port(&_sendbuflen->RS232Port);
    pHokuyo_local._4_4_ = 1;
  }
  return pHokuyo_local._4_4_;
}

Assistant:

inline int DisconnectHokuyo(HOKUYO* pHokuyo)
{		
	char sendbuf[4];
	int sendbuflen = 0;
	//char recvbuf[9];
	//int recvbuflen = 0;

	// QT command to switch off the laser.

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "QT\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error while disconnecting a Hokuyo.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
	
	//// Prepare the buffers.
	//memset(recvbuf, 0, sizeof(recvbuf));
	//recvbuflen = 8;

	//if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	//{
	//	printf("Error while disconnecting a Hokuyo.\n");
	//	CloseRS232Port(&pHokuyo->RS232Port);
	//	return EXIT_FAILURE;
	//}

	//// Check response.
	//if (strcmp(recvbuf, "QT\n00P\n\n") != 0)
	//{
	//	printf("Error while disconnecting a Hokuyo.\n");
	//	CloseRS232Port(&pHokuyo->RS232Port);
	//	return EXIT_FAILURE;
	//}

	if (CloseRS232Port(&pHokuyo->RS232Port) != EXIT_SUCCESS)
	{
		printf("Hokuyo disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("Hokuyo disconnected.\n");

	return EXIT_SUCCESS;
}